

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O3

int main(void)

{
  pointer *ppPVar1;
  char cVar2;
  int iVar3;
  VideoCapture cap;
  Mat frame;
  Mat mask;
  Mat img;
  Mat imgYCrCb;
  HandDetector hd;
  Mat blur;
  int local_58c;
  _InputArray local_588;
  pointer local_570;
  int local_564;
  pointer local_560;
  pointer local_558;
  undefined1 local_550 [96];
  pointer local_4f0;
  undefined4 local_4e8;
  undefined4 uStack_4e4;
  undefined4 uStack_4e0;
  int iStack_4dc;
  VideoCapture local_4d8 [48];
  Scalar local_4a8;
  double local_488;
  double dStack_480;
  pointer local_478;
  pointer pvStack_470;
  Scalar local_468;
  undefined1 local_448 [192];
  undefined1 local_388 [192];
  HandDetector local_2c8;
  Mat local_1b0 [96];
  Mat local_150 [96];
  Mat local_f0 [96];
  Mat local_90 [96];
  
  HandDetector::HandDetector(&local_2c8);
  cv::VideoCapture::VideoCapture(local_4d8,0,0);
  cVar2 = cv::VideoCapture::isOpened();
  if (cVar2 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Cannot open video capture",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18));
    std::ostream::put('\0');
    iVar3 = 1;
    std::ostream::flush();
  }
  else {
    cv::Mat::Mat((Mat *)local_448);
    cv::Mat::Mat((Mat *)local_388);
    cv::Mat::Mat(local_1b0);
    cv::Mat::Mat((Mat *)(local_388 + 0x60));
    cv::Mat::Mat((Mat *)(local_448 + 0x60));
    cv::createBackgroundSubtractorMOG2((int)local_550,16.0,true);
    local_4f0 = (pointer)local_550._0_8_;
    local_570 = (pointer)local_550._8_8_;
    iVar3 = 100;
    local_58c = 1;
    local_4e8 = 0;
    uStack_4e4 = 0;
    uStack_4e0._0_1_ = false;
    uStack_4e0._1_3_ = 0;
    iStack_4dc = 0x4060e000;
    while( true ) {
      cVar2 = cv::VideoCapture::isOpened();
      if (cVar2 == '\0') break;
      cv::VideoCapture::operator>>(local_4d8,(Mat *)local_448);
      local_550._16_4_ = 0;
      local_550._20_4_ = 0;
      local_550._0_4_ = 0x1010000;
      local_588.sz.width = 0;
      local_588.sz.height = 0;
      local_588.flags = 0x2010000;
      local_588.obj = (pointer)local_448;
      local_564 = iVar3;
      local_550._8_8_ = (pointer)local_448;
      cv::flip((_InputArray *)local_550,(_OutputArray *)&local_588,0);
      local_550._16_4_ = 0;
      local_550._20_4_ = 0;
      local_550._0_4_ = 0x1010000;
      local_588.sz.width = 0;
      local_588.sz.height = 0;
      local_588.flags = 0x2010000;
      local_588.obj = (pointer)local_448;
      local_550._8_8_ = (pointer)local_448;
      cv::flip((_InputArray *)local_550,(_OutputArray *)&local_588,1);
      cv::Mat::Mat(local_f0,(Mat *)local_448);
      local_560 = local_4f0;
      local_558 = local_570;
      if (local_570 != (pointer)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ppPVar1 = &(local_570->contour).
                     super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *(int *)ppPVar1 = *(int *)ppPVar1 + 1;
          UNLOCK();
        }
        else {
          ppPVar1 = &(local_570->contour).
                     super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *(int *)ppPVar1 = *(int *)ppPVar1 + 1;
        }
      }
      iVar3 = local_58c;
      deleteBg(local_90,local_f0,(Ptr<cv::BackgroundSubtractor> *)local_388,SUB81(&local_560,0),
               local_58c);
      cv::Mat::~Mat(local_90);
      if (local_558 != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558);
      }
      cv::Mat::~Mat(local_f0);
      local_550._16_4_ = 0;
      local_550._20_4_ = 0;
      local_550._0_4_ = 0x1010000;
      local_550._8_8_ = local_388;
      local_588.sz.width = 0;
      local_588.sz.height = 0;
      local_588.flags = 0x2010000;
      local_588.obj = (Mat *)(local_388 + 0x60);
      cv::cvtColor((cv *)local_550,&local_588,(_OutputArray *)0x24,0,iVar3);
      cv::Mat::Mat(local_150,(Mat *)(local_388 + 0x60));
      local_468.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
           (double)CONCAT44(uStack_4e4,local_4e8);
      local_468.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
           (double)CONCAT44(iStack_4dc,uStack_4e0);
      local_468.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 90.0;
      local_468.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = 0.0;
      local_488 = 255.0;
      dStack_480 = 230.0;
      local_478 = (pointer)0x4062c00000000000;
      pvStack_470 = (pointer)0x0;
      HandDetector::detectHands_range
                ((HandDetector *)local_550,(Mat *)&local_2c8,(Scalar *)local_150,&local_468);
      cv::Mat::operator=((Mat *)(local_448 + 0x60),(Mat *)local_550);
      cv::Mat::~Mat((Mat *)local_550);
      cv::Mat::~Mat(local_150);
      HandDetector::getFingers(&local_2c8);
      iVar3 = local_564;
      HandDetector::initFilters(&local_2c8);
      HandDetector::updateFilters(&local_2c8);
      HandDetector::stabilize(&local_2c8);
      HandDetector::getHigherFingers(&local_2c8);
      HandDetector::getFarthestFingers(&local_2c8);
      local_4a8.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = 255.0;
      local_4a8.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = 0.0;
      local_4a8.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 100.0;
      local_4a8.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = 0.0;
      HandDetector::drawHands(&local_2c8,(Mat *)local_448,&local_4a8,2);
      local_550._0_8_ = local_550 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_550,"hands","");
      local_588.sz.width = 0;
      local_588.sz.height = 0;
      local_588.flags = 0x1010000;
      local_588.obj = local_448;
      cv::imshow((string *)local_550,&local_588);
      if ((pointer)local_550._0_8_ != (pointer)(local_550 + 0x10)) {
        operator_delete((void *)local_550._0_8_);
      }
      local_550._0_8_ = local_550 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_550,"mask","");
      local_588.sz.width = 0;
      local_588.sz.height = 0;
      local_588.flags = 0x1010000;
      local_588.obj = local_448 + 0x60;
      cv::imshow((string *)local_550,&local_588);
      if ((pointer)local_550._0_8_ != (pointer)(local_550 + 0x10)) {
        operator_delete((void *)local_550._0_8_);
      }
      HandDetector::updateLast(&local_2c8);
      if (iVar3 < 1) {
        if (local_58c != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Background learned",0x12);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
          std::ostream::put(-0x68);
          std::ostream::flush();
        }
        local_58c = 0;
      }
      else {
        iVar3 = iVar3 + -1;
      }
      cVar2 = cv::waitKey(1);
      if (cVar2 != -1) {
        if (cVar2 == 'b') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Starting learning background.",0x1d);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
          std::ostream::put(-0x68);
          std::ostream::flush();
          local_58c = 1;
          iVar3 = 100;
        }
        else {
          if (cVar2 == 'q') {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"exit",4);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
            std::ostream::put(-0x68);
            std::ostream::flush();
            break;
          }
          printf("Key pressed: %c\n");
        }
      }
    }
    if (local_570 != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_570);
    }
    cv::Mat::~Mat((Mat *)(local_448 + 0x60));
    cv::Mat::~Mat((Mat *)(local_388 + 0x60));
    cv::Mat::~Mat(local_1b0);
    cv::Mat::~Mat((Mat *)local_388);
    cv::Mat::~Mat((Mat *)local_448);
    iVar3 = 0;
  }
  cv::VideoCapture::~VideoCapture(local_4d8);
  std::vector<ShortHand,_std::allocator<ShortHand>_>::~vector(&local_2c8.lastHands);
  std::
  vector<std::vector<Filter,_std::allocator<Filter>_>,_std::allocator<std::vector<Filter,_std::allocator<Filter>_>_>_>
  ::~vector(&local_2c8.filters);
  cv::CascadeClassifier::~CascadeClassifier(&local_2c8.cascade);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.cascadePath._M_dataplus._M_p != &local_2c8.cascadePath.field_2) {
    operator_delete(local_2c8.cascadePath._M_dataplus._M_p);
  }
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector(&local_2c8.contours);
  std::vector<Hand,_std::allocator<Hand>_>::~vector(&local_2c8.hands);
  return iVar3;
}

Assistant:

int main()
{
    HandDetector hd;
    VideoCapture cap(0);
    if (!cap.isOpened()) {
        cerr << "Cannot open video capture" << endl;
        return EXIT_FAILURE;
    }

    Mat frame, img, blur, imgYCrCb, mask;

    Scalar lower = Scalar(0, 135, 90);
    Scalar upper = Scalar(255, 230, 150);

    Ptr<BackgroundSubtractor> bgs = createBackgroundSubtractorMOG2();
    bool bgs_learn = true;
    int bgs_learnNFrames = 100;

    while (cap.isOpened()) {
        cap >> frame;
        flip(frame, frame, 0);
        flip(frame, frame, 1);

        deleteBg(frame, img, bgs, bgs_learn, hd.thresh_sens_val);
        cvtColor(img, imgYCrCb, COLOR_BGR2YCrCb);
        mask = hd.detectHands_range(imgYCrCb, lower, upper);
        hd.getFingers();

        hd.initFilters();
        hd.updateFilters();
        hd.stabilize();

        hd.getHigherFingers();
        hd.getFarthestFingers();

        hd.drawHands(frame, Scalar(255, 0, 100), 2);

        imshow("hands", frame);
        imshow("mask", mask);

        hd.updateLast();

        if (bgs_learnNFrames > 0)
            bgs_learnNFrames--;
        else if (bgs_learn) {
            bgs_learn = false;
            cout << "Background learned" << endl;
        }

        char key = waitKey(1);
        if (key != -1) {
            switch (key) {
                case 'q': // exit
                    cout << "exit" << endl;
                    return EXIT_SUCCESS;
                case 'b': // change bg
                    bgs_learnNFrames = 100;
                    bgs_learn = true;
                    cout << "Starting learning background." << endl;
                    break;
                default:
                    printf("Key pressed: %c\n", key);
                    break;
            }
        }
    }
    return EXIT_SUCCESS;
}